

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O2

mcsseg mcsout(mcscxdef *ctx,uint objid,uchar *ptr,ushort siz,mcsseg oldseg,int dirty)

{
  ushort uVar1;
  mcsdsdef **ppmVar2;
  mcsdsdef *pmVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  mcsdsdef **ppmVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined6 in_register_00000082;
  ushort *puVar11;
  uint uVar12;
  uint uVar13;
  ushort uVar14;
  
  if ((int)CONCAT62(in_register_00000082,oldseg) == 0xffff) {
    ppmVar2 = ctx->mcscxtab;
  }
  else {
    ppmVar2 = ctx->mcscxtab;
    uVar6 = (ulong)oldseg & 0xff;
    pmVar3 = ppmVar2[oldseg >> 8];
    if (((((pmVar3[uVar6].mcsdsflg & 1) == 0) && (pmVar3[uVar6].mcsdsobj == objid)) && (dirty == 0))
       && (siz <= pmVar3[uVar6].mcsdssiz)) {
      pmVar3[uVar6].mcsdsflg = pmVar3[uVar6].mcsdsflg | 1;
      return oldseg;
    }
  }
  uVar14 = ctx->mcscxmsg;
  uVar10 = 0xffff;
  uVar5 = 0;
  uVar9 = 0;
  uVar8 = objid;
  for (ppmVar7 = ppmVar2;
      (((ushort)uVar9 < uVar14 && (uVar5 < 0x100)) && (*ppmVar7 != (mcsdsdef *)0x0));
      ppmVar7 = ppmVar7 + 1) {
    puVar11 = &(*ppmVar7)->mcsdsflg;
    uVar12 = 0;
LAB_0012b2ca:
    uVar13 = (uVar9 & 0xffff) + uVar12;
    if ((uVar14 <= (ushort)uVar13) || (0xff < uVar12)) goto LAB_0012b318;
    if ((*puVar11 & 1) != 0) {
LAB_0012b307:
      uVar12 = uVar12 + 1;
      puVar11 = puVar11 + 0xc;
      goto LAB_0012b2ca;
    }
    uVar1 = puVar11[-4];
    if ((uVar1 < siz) ||
       ((((short)uVar10 != -1 && ((ushort)uVar8 <= uVar1)) ||
        (uVar10 = uVar13, uVar8 = (uint)uVar1, uVar1 != siz)))) goto LAB_0012b307;
    uVar10 = uVar9 + uVar12;
    uVar8 = (uint)siz;
LAB_0012b318:
    if (((short)uVar10 != -1) && ((ushort)uVar8 == siz)) goto LAB_0012b339;
    uVar5 = uVar5 + 1;
    uVar9 = uVar13;
  }
  if ((short)uVar10 == -1) {
    uVar6 = (ulong)siz;
    if (ctx->mcscxmax < uVar6) {
      mcscompact(ctx);
      if (ctx->mcscxmax < uVar6) {
        errsigf(ctx->mcscxerr,"TADS",6);
      }
      uVar14 = ctx->mcscxmsg;
      ppmVar2 = ctx->mcscxtab;
    }
    uVar1 = uVar14 >> 8;
    pmVar3 = ppmVar2[uVar1];
    if (pmVar3 == (mcsdsdef *)0x0) {
      pmVar3 = (mcsdsdef *)mchalo(ctx->mcscxerr,0x1800,"mcsout");
      ctx->mcscxtab[uVar1] = pmVar3;
      pmVar3 = ctx->mcscxtab[uVar1];
    }
    uVar4 = (ulong)uVar14 & 0xff;
    pmVar3[uVar4].mcsdsptr = ctx->mcscxtop;
    pmVar3[uVar4].mcsdssiz = siz;
    pmVar3[uVar4].mcsdsobj = objid;
    mcswrt(ctx,pmVar3 + uVar4,ptr,siz);
    pmVar3[uVar4].mcsdsflg = 1;
    ctx->mcscxtop = ctx->mcscxtop + uVar6;
    ctx->mcscxmax = ctx->mcscxmax - uVar6;
    ctx->mcscxmsg = ctx->mcscxmsg + 1;
  }
  else {
LAB_0012b339:
    uVar9 = uVar10 & 0xff;
    pmVar3 = ppmVar2[(uVar10 & 0xffff) >> 8];
    pmVar3[uVar9].mcsdsobj = objid;
    mcswrt(ctx,pmVar3 + uVar9,ptr,siz);
    *(byte *)&pmVar3[uVar9].mcsdsflg = (byte)pmVar3[uVar9].mcsdsflg | 1;
    uVar14 = (ushort)uVar10;
  }
  return uVar14;
}

Assistant:

mcsseg mcsout(mcscxdef *ctx, uint objid, uchar *ptr, ushort siz,
              mcsseg oldseg, int dirty)
{
    mcsdsdef  *desc;
    mcsdsdef **pagep;
    uint       i;
    uint       j;
    mcsseg     min;
    mcsseg     cur;
    ushort     minsiz;
    
    IF_DEBUG(printf("<< mcsout: objid=%d, ptr=%lx, siz=%u, oldseg=%u >>\n",
                    objid, (unsigned long)ptr, siz, oldseg));
    
    /* see if old segment can be reused */
    if (oldseg != MCSSEGINV)
    {
        desc = mcsdsc(ctx, oldseg);
        if (!(desc->mcsdsflg & MCSDSFINUSE)     /* if old seg is not in use */
            && desc->mcsdsobj == objid            /* and it has same object */
            && desc->mcsdssiz >= siz           /* and it's still big enough */
            && !dirty)      /* and the object in memory hasn't been changed */
        {
            /* we can reuse the old segment without rewriting it */
            desc->mcsdsflg |= MCSDSFINUSE;        /* mark segment as in use */
            return(oldseg);
        }
    }
    
    /* look for the smallest unused segment big enough for this object */
    for (cur = 0, min = MCSSEGINV, i = 0, pagep = ctx->mcscxtab
         ; cur < ctx->mcscxmsg && i < MCSPAGETAB && *pagep ; ++pagep, ++i)
    {
        for (j = 0, desc = *pagep ; cur < ctx->mcscxmsg && j < MCSPAGECNT
             ; ++desc, ++j, ++cur)
        {
            if (!(desc->mcsdsflg & MCSDSFINUSE)
                && desc->mcsdssiz >= siz
                && (min == MCSSEGINV || desc->mcsdssiz < minsiz))
            {
                min = cur;
                minsiz = desc->mcsdssiz;
                if (minsiz == siz) break;       /* exact match - we're done */
            }
        }
        /* quit if we found an exact match */
        if (min != MCSSEGINV && minsiz == siz) break;
    }
    
    /* if we found nothing, allocate a new segment if possible */
    if (min == MCSSEGINV)
    {
        if (siz > ctx->mcscxmax)
        {
            /* swap file is too big; compact it and try again */
            mcscompact(ctx);
            if (siz > ctx->mcscxmax)
                errsig(ctx->mcscxerr, ERR_SWAPBIG);
        }
            
        min = ctx->mcscxmsg;
        if ((min >> 8) >= MCSPAGETAB)      /* exceeded pages in page table? */
            errsig(ctx->mcscxerr, ERR_SWAPPG);
        
        if (!ctx->mcscxtab[min >> 8])         /* haven't allocate page yet? */
        {
            ctx->mcscxtab[min >> 8] = 
                (mcsdsdef *)mchalo(ctx->mcscxerr,
                                   (MCSPAGECNT * sizeof(mcsdsdef)),
                                   "mcsout");
        }

        /* set up new descriptor */
        desc = mcsdsc(ctx, min);
        desc->mcsdsptr = ctx->mcscxtop;
        desc->mcsdssiz = siz;
        desc->mcsdsobj = objid;

        /* write out the segment */
        mcswrt(ctx, desc, ptr, siz);
        desc->mcsdsflg = MCSDSFINUSE;

        /* update context information to account for new segment */
        ctx->mcscxtop += siz;             /* add to top seek offset in file */
        ctx->mcscxmax -= siz;                     /* take size out of quota */
        ctx->mcscxmsg++;                /* increment last segment allocated */
        
        return(min);
    }
    else
    {
        desc = mcsdsc(ctx, min);
        desc->mcsdsobj = objid;
        mcswrt(ctx, desc, ptr, siz);
        desc->mcsdsflg |= MCSDSFINUSE;

        return(min);
    }
}